

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command_User.cpp
# Opt level: O3

void __thiscall
userClass::changePassword(userClass *this,string *userID,string *newPass,string *oldPass)

{
  pointer pcVar1;
  size_t sVar2;
  int iVar3;
  vector<int,_std::allocator<int>_> index;
  string password_origin;
  fstream file;
  vector<int,_std::allocator<int>_> local_2b8;
  string local_2a0;
  string local_280;
  string local_260;
  fstream local_240 [528];
  
  pcVar1 = (userID->_M_dataplus)._M_p;
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_260,pcVar1,pcVar1 + userID->_M_string_length);
  unrolledLinkedListClass::readIndexData(&local_2b8,&Userid,&local_260,'0');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((long)local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 4) {
    success = '0';
    puts("Invalid");
    goto LAB_001051ff;
  }
  std::fstream::fstream(local_240);
  std::fstream::open((char *)local_240,0x1100c8);
  std::istream::seekg(local_240,
                      (long)*local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start * 0x5b + 0x3d,0);
  local_2a0._M_string_length = 0;
  local_2a0.field_2._M_local_buf[0] = '\0';
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  read_string(local_240,&local_2a0,0x1e);
  sVar2 = oldPass->_M_string_length;
  if (sVar2 == local_2a0._M_string_length) {
    if (sVar2 != 0) {
      iVar3 = bcmp((oldPass->_M_dataplus)._M_p,local_2a0._M_dataplus._M_p,sVar2);
      if (iVar3 != 0) goto LAB_00105112;
    }
LAB_0010515b:
    pcVar1 = (newPass->_M_dataplus)._M_p;
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_280,pcVar1,pcVar1 + newPass->_M_string_length);
    dataClass::changeUserData
              ((dataClass *)&data_manager,&local_280,
               *local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    sVar2 = (this->userID)._M_string_length;
    if (sVar2 == userID->_M_string_length) {
      if (sVar2 != 0) {
        iVar3 = bcmp((this->userID)._M_dataplus._M_p,(userID->_M_dataplus)._M_p,sVar2);
        if (iVar3 != 0) goto LAB_001051d4;
      }
      std::__cxx11::string::_M_assign((string *)&this->password);
    }
  }
  else {
LAB_00105112:
    iVar3 = std::__cxx11::string::compare((char *)oldPass);
    if (iVar3 == 0) goto LAB_0010515b;
    success = '0';
    puts("Invalid");
  }
LAB_001051d4:
  std::fstream::close();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,
                    CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                             local_2a0.field_2._M_local_buf[0]) + 1);
  }
  std::fstream::~fstream(local_240);
LAB_001051ff:
  if (local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void userClass::changePassword(string userID, string newPass, string oldPass) {
	vector<int> index = Userid.readIndexData(userID, '0');
	if (index.size() != 1) {ERROR; return ;}
	fstream file;
	file.open("Data_User.dat", ios::in | ios::binary);
	file.seekg(index[0] * 91 + 61);
	string password_origin;
	read_string(file, password_origin, 30);
	if (oldPass == password_origin || oldPass == "#"){
		data_manager.changeUserData(newPass, index[0]);
		if (this->userID == userID) this->password = newPass;
	} else ERROR;
	file.close();
}